

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_ecmult_target(secp256k1_scalar *target,int mode)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  int iVar5;
  secp256k1_scratch_space *scratch;
  long lVar6;
  uint uVar7;
  secp256k1_scalar *psVar8;
  long lVar9;
  long extraout_RDX;
  secp256k1_gej *scratch_00;
  size_t len;
  long extraout_RDX_00;
  secp256k1_gej *r;
  secp256k1_ge *psVar10;
  ulong uVar11;
  secp256k1_strauss_point_state *psVar12;
  uchar *out32;
  ulong uVar13;
  secp256k1_gej *psVar14;
  secp256k1_gej *psVar15;
  secp256k1_gej *psVar16;
  secp256k1_ge *psVar17;
  secp256k1_sha256 *hash;
  secp256k1_strauss_point_state *psVar18;
  secp256k1_ge *psVar19;
  uint64_t *puVar20;
  code *cb;
  secp256k1_scalar **cbdata;
  secp256k1_scalar **ppsVar21;
  secp256k1_fe *unaff_R12;
  secp256k1_sha256 *acc;
  secp256k1_callback *error_callback;
  secp256k1_ge *unaff_R13;
  secp256k1_scalar *psVar22;
  long lVar23;
  byte bVar24;
  secp256k1_scalar n2;
  secp256k1_scalar n1;
  secp256k1_gej ptj;
  secp256k1_gej p2j;
  secp256k1_gej p1j;
  secp256k1_ge p;
  secp256k1_gej pj;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_strauss_point_state ps [1];
  size_t sStack_3960;
  secp256k1_scalar *psStack_3940;
  secp256k1_ge *psStack_3938;
  ulong uStack_3930;
  ulong uStack_3928;
  ulong uStack_3920;
  ulong uStack_3918;
  ulong uStack_3910;
  ulong uStack_3908;
  secp256k1_scalar sStack_3900;
  secp256k1_scalar sStack_38e0;
  secp256k1_strauss_state sStack_38c0;
  secp256k1_gej sStack_38a8;
  undefined1 auStack_3810 [152];
  secp256k1_gej sStack_3778;
  secp256k1_gej sStack_36e0;
  secp256k1_scalar sStack_3648;
  secp256k1_scalar sStack_3628;
  secp256k1_scalar sStack_3608;
  secp256k1_scalar sStack_35e8;
  secp256k1_scalar asStack_35c8 [28];
  secp256k1_gej sStack_3248;
  secp256k1_scalar sStack_31b0;
  secp256k1_scalar sStack_3190;
  secp256k1_gej sStack_3170;
  secp256k1_fe asStack_30d8 [8];
  secp256k1_ge asStack_2f58 [8];
  secp256k1_ge sStack_2c10;
  secp256k1_strauss_point_state sStack_2ba8;
  secp256k1_ge sStack_2798;
  secp256k1_ge asStack_2730 [31];
  secp256k1_gej *psStack_1a90;
  secp256k1_callback *psStack_1a88;
  secp256k1_gej *psStack_1a78;
  secp256k1_strauss_point_state *psStack_1a70;
  secp256k1_scalar *psStack_1a68;
  secp256k1_gej *psStack_1a60;
  undefined1 auStack_1a48 [8];
  undefined1 auStack_1a40 [176];
  secp256k1_gej sStack_1990;
  secp256k1_gej sStack_18f8;
  secp256k1_gej sStack_1860;
  secp256k1_gej sStack_17c8;
  secp256k1_gej sStack_1730;
  secp256k1_gej asStack_1698 [2];
  secp256k1_gej asStack_1518 [5];
  secp256k1_strauss_point_state sStack_11d8;
  secp256k1_scratch_space *psStack_dc0;
  secp256k1_sha256 *psStack_db8;
  undefined1 *puStack_db0;
  secp256k1_gej *psStack_da8;
  secp256k1_gej *psStack_da0;
  code *pcStack_d98;
  undefined4 uStack_d86;
  undefined2 uStack_d82;
  secp256k1_gej *psStack_d80;
  long lStack_d78;
  undefined1 auStack_d70 [40];
  undefined8 uStack_d48;
  uint64_t uStack_d40;
  uint64_t uStack_d38;
  secp256k1_sha256 sStack_d30;
  secp256k1_sha256 sStack_cc0;
  secp256k1_gej *psStack_c58;
  secp256k1_fe *psStack_c50;
  secp256k1_ge *psStack_c48;
  secp256k1_ge *psStack_c40;
  secp256k1_gej *psStack_c38;
  secp256k1_strauss_point_state *psStack_c30;
  undefined1 auStack_c28 [32];
  undefined1 local_c08 [40];
  secp256k1_ge *local_be0;
  secp256k1_strauss_point_state *local_bd8;
  secp256k1_gej local_bd0;
  secp256k1_gej local_b38;
  secp256k1_gej local_aa0;
  secp256k1_ge local_a08;
  secp256k1_gej local_9a0;
  secp256k1_fe local_908 [8];
  secp256k1_ge local_788 [8];
  secp256k1_strauss_point_state local_448;
  
  bVar24 = 0;
  psVar16 = (secp256k1_gej *)auStack_c28;
  psVar12 = (secp256k1_strauss_point_state *)(ulong)(uint)mode;
  psVar22 = (secp256k1_scalar *)local_c08;
  psStack_c30 = (secp256k1_strauss_point_state *)0x1561a9;
  testutil_random_scalar_order_test(psVar22);
  psStack_c30 = (secp256k1_strauss_point_state *)0x1561ba;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_c28,psVar22,target);
  psStack_c30 = (secp256k1_strauss_point_state *)0x1561c5;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_c28,(secp256k1_scalar *)auStack_c28);
  if (mode == 0) {
    psStack_c30 = (secp256k1_strauss_point_state *)0x1562be;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_aa0,(secp256k1_scalar *)local_c08);
    psStack_c30 = (secp256k1_strauss_point_state *)0x1562d5;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_b38,(secp256k1_scalar *)auStack_c28);
    psStack_c30 = (secp256k1_strauss_point_state *)0x1562e9;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_bd0,target);
  }
  else {
    psStack_c30 = (secp256k1_strauss_point_state *)0x1561dd;
    testutil_random_ge_test(&local_a08);
    psStack_c30 = (secp256k1_strauss_point_state *)0x1561ed;
    secp256k1_gej_set_ge(&local_9a0,&local_a08);
    if (mode == 1) {
      unaff_R12 = local_908;
      unaff_R13 = local_788;
      psVar12 = &local_448;
      psVar22 = &secp256k1_scalar_zero;
      psStack_c30 = (secp256k1_strauss_point_state *)0x15624d;
      local_b38.x.n[0] = (uint64_t)unaff_R12;
      local_b38.x.n[1] = (uint64_t)unaff_R13;
      local_b38.x.n[2] = (uint64_t)psVar12;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_b38,&local_aa0,1,&local_9a0,
                 (secp256k1_scalar *)local_c08,&secp256k1_scalar_zero);
      psStack_c30 = (secp256k1_strauss_point_state *)0x156278;
      local_bd0.x.n[0] = (uint64_t)unaff_R12;
      local_bd0.x.n[1] = (uint64_t)unaff_R13;
      local_bd0.x.n[2] = (uint64_t)psVar12;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_bd0,&local_b38,1,&local_9a0,
                 (secp256k1_scalar *)auStack_c28,&secp256k1_scalar_zero);
      psStack_c30 = (secp256k1_strauss_point_state *)0x1562a0;
      local_c08._32_8_ = unaff_R12;
      local_be0 = unaff_R13;
      local_bd8 = psVar12;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)(local_c08 + 0x20),&local_bd0,1,&local_9a0,target,
                 &secp256k1_scalar_zero);
      psVar16 = &local_9a0;
    }
    else {
      psVar22 = (secp256k1_scalar *)&local_a08;
      psStack_c30 = (secp256k1_strauss_point_state *)0x156308;
      secp256k1_ecmult_const(&local_aa0,(secp256k1_ge *)psVar22,(secp256k1_scalar *)local_c08);
      psStack_c30 = (secp256k1_strauss_point_state *)0x15631b;
      secp256k1_ecmult_const(&local_b38,(secp256k1_ge *)psVar22,(secp256k1_scalar *)auStack_c28);
      psStack_c30 = (secp256k1_strauss_point_state *)0x15632b;
      secp256k1_ecmult_const(&local_bd0,(secp256k1_ge *)psVar22,target);
      psVar16 = (secp256k1_gej *)auStack_c28;
    }
  }
  psStack_c30 = (secp256k1_strauss_point_state *)0x156345;
  secp256k1_gej_add_var(&local_bd0,&local_bd0,&local_aa0,(secp256k1_fe *)0x0);
  psStack_c30 = (secp256k1_strauss_point_state *)0x15635a;
  psVar14 = &local_bd0;
  secp256k1_gej_add_var(&local_bd0,&local_bd0,&local_b38,(secp256k1_fe *)0x0);
  psStack_c30 = (secp256k1_strauss_point_state *)0x156362;
  psVar15 = &local_bd0;
  secp256k1_gej_verify(&local_bd0);
  if (local_bd0.infinity != 0) {
    return;
  }
  psStack_c30 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (uchar *)((ulong)psVar15 & 0xffffffff);
  pcStack_d98 = (code *)0x1563b0;
  psStack_d80 = psVar14;
  lStack_d78 = extraout_RDX;
  psStack_c58 = &local_bd0;
  psStack_c50 = unaff_R12;
  psStack_c48 = unaff_R13;
  psStack_c40 = (secp256k1_ge *)psVar22;
  psStack_c38 = psVar16;
  psStack_c30 = psVar12;
  scratch = secp256k1_scratch_space_create(CTX,0x10000);
  uStack_d86 = SUB84(psVar15,0);
  acc = &sStack_cc0;
  sStack_cc0.s[0] = 0x6a09e667;
  sStack_cc0.s[1] = 0xbb67ae85;
  sStack_cc0.s[2] = 0x3c6ef372;
  sStack_cc0.s[3] = 0xa54ff53a;
  sStack_cc0.s[4] = 0x510e527f;
  sStack_cc0.s[5] = 0x9b05688c;
  sStack_cc0.s[6] = 0x1f83d9ab;
  sStack_cc0.s[7] = 0x5be0cd19;
  psVar14 = (secp256k1_gej *)0x0;
  sStack_cc0.bytes = 0;
  psVar22 = (secp256k1_scalar *)(auStack_d70 + 0x20);
  auStack_d70._32_8_ = 0;
  uStack_d48._0_4_ = 0;
  uStack_d48._4_4_ = 0;
  uStack_d40 = 0;
  uStack_d38 = 0;
  pcStack_d98 = (code *)0x1563fa;
  secp256k1_scalar_verify(psVar22);
  pcStack_d98 = (code *)0x156408;
  test_ecmult_accumulate(acc,psVar22,scratch);
  auStack_d70._32_8_ = 1;
  uStack_d48._0_4_ = 0;
  uStack_d48._4_4_ = 0;
  uStack_d40 = 0;
  uStack_d38 = 0;
  pcStack_d98 = (code *)0x156424;
  secp256k1_scalar_verify(psVar22);
  pcStack_d98 = (code *)0x156432;
  test_ecmult_accumulate(acc,psVar22,scratch);
  pcStack_d98 = (code *)0x15643d;
  secp256k1_scalar_negate(psVar22,psVar22);
  pcStack_d98 = (code *)0x15644e;
  test_ecmult_accumulate(acc,psVar22,scratch);
  psVar16 = psStack_d80;
  if (psStack_d80 != (secp256k1_gej *)0x0) {
    psVar14 = (secp256k1_gej *)0x0;
    acc = &sStack_d30;
    out32 = auStack_d70;
    do {
      uStack_d82 = SUB82(psVar14,0);
      sStack_d30.s[0] = 0x6a09e667;
      sStack_d30.s[1] = 0xbb67ae85;
      sStack_d30.s[2] = 0x3c6ef372;
      sStack_d30.s[3] = 0xa54ff53a;
      sStack_d30.s[4] = 0x510e527f;
      sStack_d30.s[5] = 0x9b05688c;
      sStack_d30.s[6] = 0x1f83d9ab;
      sStack_d30.s[7] = 0x5be0cd19;
      sStack_d30.bytes = 0;
      pcStack_d98 = (code *)0x1564aa;
      secp256k1_sha256_write(acc,(uchar *)&uStack_d86,6);
      pcStack_d98 = (code *)0x1564b5;
      secp256k1_sha256_finalize(acc,out32);
      pcStack_d98 = (code *)0x1564c2;
      secp256k1_scalar_set_b32((secp256k1_scalar *)(auStack_d70 + 0x20),out32,(int *)0x0);
      pcStack_d98 = (code *)0x1564d5;
      test_ecmult_accumulate(&sStack_cc0,(secp256k1_scalar *)(auStack_d70 + 0x20),scratch);
      psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + 1);
    } while (psVar16 != psVar14);
  }
  hash = &sStack_cc0;
  psVar15 = (secp256k1_gej *)auStack_d70;
  pcStack_d98 = (code *)0x1564ef;
  secp256k1_sha256_finalize(hash,(uchar *)psVar15);
  lVar6 = 0;
  while (auStack_d70[lVar6] == *(char *)(lStack_d78 + lVar6)) {
    lVar6 = lVar6 + 1;
    if (lVar6 == 0x20) {
      pcStack_d98 = (code *)0x156517;
      secp256k1_scratch_space_destroy(CTX,scratch);
      return;
    }
  }
  pcStack_d98 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  psStack_da0 = psVar16;
  auStack_1a48 = (undefined1  [8])0x41;
  psStack_1a60 = (secp256k1_gej *)0x156567;
  psStack_dc0 = scratch;
  psStack_db8 = acc;
  puStack_db0 = auStack_d70 + 0x20;
  psStack_da8 = psVar14;
  pcStack_d98 = (code *)out32;
  secp256k1_gej_set_ge(&sStack_1860,&secp256k1_ge_const_g);
  psStack_1a60 = (secp256k1_gej *)0x156574;
  secp256k1_gej_set_infinity(&sStack_18f8);
  psStack_1a60 = (secp256k1_gej *)0x15658b;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_17c8 + 1,(secp256k1_scalar *)psVar15);
  psVar12 = (secp256k1_strauss_point_state *)(asStack_1518[5].y.n + 3);
  psStack_1a60 = (secp256k1_gej *)0x1565dd;
  sStack_1990.x.n[0] = (uint64_t)asStack_1698;
  sStack_1990.x.n[1] = (uint64_t)asStack_1518;
  sStack_1990.x.n[2] = (uint64_t)psVar12;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1990,&sStack_17c8,1,&sStack_1860,
             (secp256k1_scalar *)psVar15,&secp256k1_scalar_zero);
  psStack_1a60 = (secp256k1_gej *)0x15660d;
  auStack_1a40._0_8_ = asStack_1698;
  auStack_1a40._8_8_ = asStack_1518;
  auStack_1a40._16_8_ = psVar12;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)auStack_1a40,&sStack_1990,1,&sStack_18f8,
             &secp256k1_scalar_zero,(secp256k1_scalar *)psVar15);
  error_callback = (secp256k1_callback *)0xd0;
  psVar14 = (secp256k1_gej *)&CTX->error_callback;
  psStack_1a60 = (secp256k1_gej *)0x15663e;
  psVar22 = (secp256k1_scalar *)psVar15;
  psVar16 = scratch_00;
  iVar4 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)psVar14,(secp256k1_scratch *)scratch_00,
                     (secp256k1_gej *)(asStack_1518[5].y.n + 3),(secp256k1_scalar *)psVar15,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar4 == 0) {
    psStack_1a60 = (secp256k1_gej *)0x1567a3;
    test_ecmult_accumulate_cold_8();
LAB_001567a3:
    psStack_1a60 = (secp256k1_gej *)0x1567a8;
    test_ecmult_accumulate_cold_7();
LAB_001567a8:
    psStack_1a60 = (secp256k1_gej *)0x1567ad;
    test_ecmult_accumulate_cold_6();
LAB_001567ad:
    psStack_1a60 = (secp256k1_gej *)0x1567b2;
    test_ecmult_accumulate_cold_5();
LAB_001567b2:
    psStack_1a60 = (secp256k1_gej *)0x1567b7;
    test_ecmult_accumulate_cold_4();
LAB_001567b7:
    psStack_1a60 = (secp256k1_gej *)0x1567bc;
    test_ecmult_accumulate_cold_3();
LAB_001567bc:
    psStack_1a60 = (secp256k1_gej *)0x1567c1;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    psVar22 = &secp256k1_scalar_zero;
    psStack_1a60 = (secp256k1_gej *)0x156679;
    psVar16 = scratch_00;
    psVar14 = (secp256k1_gej *)error_callback;
    iVar4 = secp256k1_ecmult_multi_var
                      (error_callback,(secp256k1_scratch *)scratch_00,asStack_1518,
                       &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar15,1);
    if (iVar4 == 0) goto LAB_001567a3;
    psStack_1a60 = (secp256k1_gej *)0x156698;
    secp256k1_ecmult_const(asStack_1698,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar15);
    psVar15 = (secp256k1_gej *)auStack_1a40;
    psStack_1a60 = (secp256k1_gej *)0x1566ad;
    secp256k1_ge_set_gej_var((secp256k1_ge *)psVar15,&sStack_17c8 + 1);
    psVar14 = &sStack_17c8;
    psStack_1a60 = (secp256k1_gej *)0x1566bd;
    psVar16 = psVar15;
    iVar4 = secp256k1_gej_eq_ge_var(psVar14,(secp256k1_ge *)psVar15);
    if (iVar4 == 0) goto LAB_001567a8;
    psVar14 = &sStack_1990;
    psVar16 = (secp256k1_gej *)auStack_1a40;
    psStack_1a60 = (secp256k1_gej *)0x1566d7;
    iVar4 = secp256k1_gej_eq_ge_var(psVar14,(secp256k1_ge *)psVar16);
    if (iVar4 == 0) goto LAB_001567ad;
    psVar14 = (secp256k1_gej *)(asStack_1518[5].y.n + 3);
    psVar16 = (secp256k1_gej *)auStack_1a40;
    psStack_1a60 = (secp256k1_gej *)0x1566f1;
    iVar4 = secp256k1_gej_eq_ge_var(psVar14,(secp256k1_ge *)psVar16);
    if (iVar4 == 0) goto LAB_001567b2;
    psVar14 = asStack_1518;
    psVar16 = (secp256k1_gej *)auStack_1a40;
    psStack_1a60 = (secp256k1_gej *)0x15670b;
    iVar4 = secp256k1_gej_eq_ge_var(psVar14,(secp256k1_ge *)psVar16);
    if (iVar4 == 0) goto LAB_001567b7;
    psVar14 = asStack_1698;
    psVar16 = (secp256k1_gej *)auStack_1a40;
    psStack_1a60 = (secp256k1_gej *)0x156725;
    iVar4 = secp256k1_gej_eq_ge_var(psVar14,(secp256k1_ge *)psVar16);
    if (iVar4 == 0) goto LAB_001567bc;
    psStack_1a60 = (secp256k1_gej *)0x15673a;
    secp256k1_ge_verify((secp256k1_ge *)auStack_1a40);
    if (auStack_1a40._96_4_ != 0) {
      auStack_1a40[0x68] = 0;
      len = 1;
LAB_00156782:
      psStack_1a60 = (secp256k1_gej *)0x15678c;
      secp256k1_sha256_write(hash,auStack_1a40 + 0x68,len);
      return;
    }
    psVar14 = (secp256k1_gej *)auStack_1a40;
    psVar16 = (secp256k1_gej *)(auStack_1a40 + 0x68);
    psVar15 = (secp256k1_gej *)auStack_1a48;
    psVar22 = (secp256k1_scalar *)0x0;
    psStack_1a60 = (secp256k1_gej *)0x15676f;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)psVar14,(uchar *)psVar16,(size_t *)psVar15,0);
    if (auStack_1a48 == (undefined1  [8])0x41) {
      len = 0x41;
      goto LAB_00156782;
    }
  }
  psStack_1a60 = (secp256k1_gej *)test_ecmult_accumulate_cb;
  test_ecmult_accumulate_cold_1();
  uVar1 = (((secp256k1_gej *)psVar22)->x).n[0];
  uVar2 = (((secp256k1_gej *)psVar22)->x).n[1];
  uVar3 = (((secp256k1_gej *)psVar22)->x).n[3];
  (psVar14->x).n[2] = (((secp256k1_gej *)psVar22)->x).n[2];
  (psVar14->x).n[3] = uVar3;
  (psVar14->x).n[0] = uVar1;
  (psVar14->x).n[1] = uVar2;
  psVar17 = &secp256k1_ge_const_g;
  psVar14 = psVar16;
  for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
    (psVar14->x).n[0] = (psVar17->x).n[0];
    psVar17 = (secp256k1_ge *)((long)psVar17 + (ulong)bVar24 * -0x10 + 8);
    psVar14 = (secp256k1_gej *)((long)psVar14 + (ulong)bVar24 * -0x10 + 8);
  }
  if (extraout_RDX_00 == 0) {
    return;
  }
  psStack_1a68 = (secp256k1_scalar *)test_ecmult_multi;
  psStack_1a60 = psVar16;
  test_ecmult_accumulate_cb_cold_1();
  psStack_1a68 = &secp256k1_scalar_zero;
  psStack_3940 = &sStack_3648;
  cbdata = &psStack_3940;
  psStack_3938 = &sStack_2798;
  psVar18 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  cb = ecmult_multi_callback;
  psVar22 = (secp256k1_scalar *)0x0;
  psVar16 = psVar14;
  psStack_1a90 = asStack_1698;
  psStack_1a88 = error_callback;
  psStack_1a78 = psVar15;
  psStack_1a70 = psVar12;
  iVar4 = (*(code *)psVar17)(psVar18,psVar14,auStack_3810);
  if (iVar4 == 0) goto LAB_00157831;
  if (0 < COUNT) {
    uVar7 = 0;
    do {
      ppsVar21 = &psStack_3940;
      testutil_random_scalar_order(&sStack_3648);
      testutil_random_scalar_order(&sStack_3628);
      testutil_random_ge_test((secp256k1_ge *)&sStack_3170);
      secp256k1_gej_set_ge(&sStack_3778,(secp256k1_ge *)&sStack_3170);
      sStack_38a8.x.n[2] = (uint64_t)&sStack_2ba8;
      psVar15 = &sStack_3248;
      psVar16 = &sStack_3170;
      psVar10 = &sStack_2798;
      for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
        (psVar10->x).n[0] = (psVar16->x).n[0];
        psVar16 = (secp256k1_gej *)((long)psVar16 + (ulong)bVar24 * -0x10 + 8);
        psVar10 = (secp256k1_ge *)((long)psVar10 + ((ulong)bVar24 * -2 + 1) * 8);
      }
      psVar10 = &secp256k1_ge_const_g;
      psVar19 = asStack_2730;
      for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
        (psVar19->x).n[0] = (psVar10->x).n[0];
        psVar10 = (secp256k1_ge *)((long)psVar10 + ((ulong)bVar24 * -2 + 1) * 8);
        psVar19 = (secp256k1_ge *)((long)psVar19 + ((ulong)bVar24 * -2 + 1) * 8);
      }
      sStack_38a8.x.n[0] = (uint64_t)asStack_30d8;
      sStack_38a8.x.n[1] = (uint64_t)asStack_2f58;
      psVar8 = &sStack_3648;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_38a8,psVar15,1,&sStack_3778,
                 &secp256k1_scalar_zero,psVar8);
      psVar18 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      psVar16 = psVar14;
      iVar4 = (*(code *)psVar17)(psVar18,psVar14,(secp256k1_strauss_point_state *)auStack_3810);
      if (iVar4 == 0) goto LAB_001577f0;
      psVar16 = psVar15;
      psVar18 = (secp256k1_strauss_point_state *)auStack_3810;
      iVar4 = secp256k1_gej_eq_var((secp256k1_gej *)auStack_3810,psVar15);
      if (iVar4 == 0) goto LAB_001577f5;
      sStack_38a8.x.n[0] = (uint64_t)asStack_30d8;
      sStack_38a8.x.n[1] = (uint64_t)asStack_2f58;
      sStack_38a8.x.n[2] = (uint64_t)&sStack_2ba8;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_38a8,psVar15,1,&sStack_3778,&sStack_3648,
                 &secp256k1_scalar_zero);
      psVar18 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      ppsVar21 = &psStack_3940;
      psVar8 = &secp256k1_scalar_zero;
      psVar16 = psVar14;
      iVar4 = (*(code *)psVar17)(psVar18,psVar14,(secp256k1_strauss_point_state *)auStack_3810);
      if (iVar4 == 0) goto LAB_001577fa;
      psVar18 = (secp256k1_strauss_point_state *)auStack_3810;
      iVar4 = secp256k1_gej_eq_var((secp256k1_gej *)auStack_3810,psVar15);
      if (iVar4 == 0) goto LAB_001577ff;
      psVar18 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_false_callback;
      cbdata = &psStack_3940;
      psVar8 = &secp256k1_scalar_zero;
      psVar15 = psVar14;
      ppsVar21 = cbdata;
      iVar4 = (*(code *)psVar17)(psVar18,psVar14,(secp256k1_strauss_point_state *)auStack_3810);
      if (iVar4 != 0) goto LAB_00157804;
      sStack_38a8.x.n[0] = (uint64_t)asStack_30d8;
      sStack_38a8.x.n[1] = (uint64_t)asStack_2f58;
      sStack_38a8.x.n[2] = (uint64_t)&sStack_2ba8;
      psVar16 = &sStack_3248;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_38a8,psVar16,1,&sStack_3778,&sStack_3648,
                 &sStack_3628);
      psVar18 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      psVar8 = &secp256k1_scalar_zero;
      psVar15 = psVar14;
      iVar4 = (*(code *)psVar17)(psVar18,psVar14,(secp256k1_strauss_point_state *)auStack_3810);
      if (iVar4 == 0) goto LAB_00157809;
      psVar15 = psVar16;
      psVar18 = (secp256k1_strauss_point_state *)auStack_3810;
      iVar4 = secp256k1_gej_eq_var((secp256k1_gej *)auStack_3810,psVar16);
      if (iVar4 == 0) goto LAB_0015780e;
      sStack_38a8.x.n[0] = (uint64_t)asStack_30d8;
      sStack_38a8.x.n[1] = (uint64_t)asStack_2f58;
      sStack_38a8.x.n[2] = (uint64_t)&sStack_2ba8;
      psVar8 = &sStack_3628;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_38a8,psVar16,1,&sStack_3778,&sStack_3648,psVar8)
      ;
      psVar18 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cbdata = &psStack_3940;
      cb = ecmult_multi_callback;
      psVar15 = psVar14;
      iVar4 = (*(code *)psVar17)(psVar18,psVar14,(secp256k1_strauss_point_state *)auStack_3810);
      if (iVar4 == 0) goto LAB_00157813;
      psVar18 = (secp256k1_strauss_point_state *)auStack_3810;
      iVar4 = secp256k1_gej_eq_var((secp256k1_gej *)auStack_3810,psVar16);
      psVar8 = (secp256k1_scalar *)(ulong)uVar7;
      if (iVar4 == 0) goto LAB_00157818;
      uVar7 = uVar7 + 1;
    } while ((int)uVar7 < COUNT);
    if (0 < COUNT) {
      uVar7 = 0;
      do {
        psVar22 = (secp256k1_scalar *)(ulong)uVar7;
        lVar6 = 0;
        do {
          psVar10 = &sStack_2798;
          lVar23 = 0;
          do {
            testutil_random_scalar_order((secp256k1_scalar *)((long)sStack_3648.d + lVar23));
            secp256k1_ge_set_infinity(psVar10);
            lVar23 = lVar23 + 0x20;
            psVar10 = psVar10 + 1;
          } while (lVar23 != 0x400);
          psVar18 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar8 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar21 = &psStack_3940;
          psVar16 = psVar14;
          iVar4 = (*(code *)psVar17)(psVar18,psVar14,(secp256k1_strauss_point_state *)auStack_3810);
          if (iVar4 == 0) goto LAB_001577c8;
          psVar18 = (secp256k1_strauss_point_state *)auStack_3810;
          secp256k1_gej_verify((secp256k1_gej *)auStack_3810);
          if (auStack_3810._144_4_ == 0) goto LAB_001577cd;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        lVar6 = 0;
        do {
          psVar8 = &sStack_3648;
          lVar23 = 0;
          do {
            testutil_random_ge_test((secp256k1_ge *)&sStack_2ba8);
            psVar12 = &sStack_2ba8;
            puVar20 = (uint64_t *)((long)sStack_2798.x.n + lVar23);
            for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
              *puVar20 = ((secp256k1_fe *)psVar12->wnaf_na_1)->n[0];
              psVar12 = (secp256k1_strauss_point_state *)((long)psVar12 + (ulong)bVar24 * -0x10 + 8)
              ;
              puVar20 = puVar20 + (ulong)bVar24 * -2 + 1;
            }
            psVar8->d[2] = 0;
            psVar8->d[3] = 0;
            psVar8->d[0] = 0;
            psVar8->d[1] = 0;
            secp256k1_scalar_verify(psVar8);
            lVar23 = lVar23 + 0x68;
            psVar8 = psVar8 + 1;
          } while (lVar23 != 0xd00);
          psVar18 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar8 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar21 = &psStack_3940;
          psVar16 = psVar14;
          iVar4 = (*(code *)psVar17)(psVar18,psVar14,(secp256k1_strauss_point_state *)auStack_3810);
          if (iVar4 == 0) goto LAB_001577d2;
          psVar18 = (secp256k1_strauss_point_state *)auStack_3810;
          secp256k1_gej_verify((secp256k1_gej *)auStack_3810);
          if (auStack_3810._144_4_ == 0) goto LAB_001577d7;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        lVar6 = 0;
        do {
          testutil_random_ge_test((secp256k1_ge *)&sStack_2ba8);
          lVar23 = 0x68;
          psVar8 = &sStack_3648;
          do {
            testutil_random_scalar_order(psVar8);
            secp256k1_scalar_negate(psVar8 + 1,psVar8);
            psVar12 = &sStack_2ba8;
            puVar20 = (uint64_t *)((long)(&sStack_2798)[-1].x.n + lVar23);
            for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
              *puVar20 = ((secp256k1_fe *)psVar12->wnaf_na_1)->n[0];
              psVar12 = (secp256k1_strauss_point_state *)((long)psVar12 + (ulong)bVar24 * -0x10 + 8)
              ;
              puVar20 = puVar20 + (ulong)bVar24 * -2 + 1;
            }
            psVar12 = &sStack_2ba8;
            puVar20 = (uint64_t *)((long)sStack_2798.x.n + lVar23);
            for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
              *puVar20 = ((secp256k1_fe *)psVar12->wnaf_na_1)->n[0];
              psVar12 = (secp256k1_strauss_point_state *)((long)psVar12 + (ulong)bVar24 * -0x10 + 8)
              ;
              puVar20 = puVar20 + (ulong)bVar24 * -2 + 1;
            }
            lVar23 = lVar23 + 0xd0;
            psVar8 = psVar8 + 2;
          } while (lVar23 != 0xd68);
          psVar18 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar8 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar21 = &psStack_3940;
          psVar16 = psVar14;
          iVar4 = (*(code *)psVar17)(psVar18,psVar14,(secp256k1_strauss_point_state *)auStack_3810);
          if (iVar4 == 0) goto LAB_001577dc;
          psVar18 = (secp256k1_strauss_point_state *)auStack_3810;
          secp256k1_gej_verify((secp256k1_gej *)auStack_3810);
          if (auStack_3810._144_4_ == 0) goto LAB_001577e1;
          testutil_random_scalar_order(&sStack_3648);
          lVar23 = 0x20;
          psVar10 = &sStack_2798;
          do {
            testutil_random_ge_test((secp256k1_ge *)&sStack_2ba8);
            uVar2 = sStack_3648.d[3];
            uVar1 = sStack_3648.d[1];
            *(uint64_t *)((long)sStack_36e0.z.n + lVar23 + 0x28) = sStack_3648.d[2];
            *(uint64_t *)((long)(&sStack_36e0.z + 1) + lVar23) = uVar2;
            *(uint64_t *)((long)sStack_36e0.z.n + lVar23 + 0x18) = sStack_3648.d[0];
            *(uint64_t *)((long)sStack_36e0.z.n + lVar23 + 0x20) = uVar1;
            *(uint64_t *)((long)sStack_3648.d + lVar23) = sStack_3648.d[0];
            *(uint64_t *)((long)sStack_3648.d + lVar23 + 8) = sStack_3648.d[1];
            *(uint64_t *)((long)sStack_3648.d + lVar23 + 0x10) = sStack_3648.d[2];
            *(uint64_t *)((long)sStack_3648.d + lVar23 + 0x18) = sStack_3648.d[3];
            psVar12 = &sStack_2ba8;
            psVar19 = psVar10;
            for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
              (psVar19->x).n[0] = ((secp256k1_fe *)psVar12->wnaf_na_1)->n[0];
              psVar12 = (secp256k1_strauss_point_state *)((long)psVar12 + (ulong)bVar24 * -0x10 + 8)
              ;
              psVar19 = (secp256k1_ge *)((long)psVar19 + (ulong)bVar24 * -0x10 + 8);
            }
            secp256k1_ge_neg(psVar10 + 1,psVar10);
            lVar23 = lVar23 + 0x40;
            psVar10 = psVar10 + 2;
          } while (lVar23 != 0x420);
          psVar18 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar8 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar21 = &psStack_3940;
          psVar16 = psVar14;
          iVar4 = (*(code *)psVar17)(psVar18,psVar14,(secp256k1_strauss_point_state *)auStack_3810);
          if (iVar4 == 0) goto LAB_001577e6;
          psVar18 = (secp256k1_strauss_point_state *)auStack_3810;
          secp256k1_gej_verify((secp256k1_gej *)auStack_3810);
          if (auStack_3810._144_4_ == 0) goto LAB_001577eb;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        testutil_random_ge_test((secp256k1_ge *)&sStack_2ba8);
        sStack_3648.d[2] = 0;
        sStack_3648.d[3] = 0;
        sStack_3648.d[0] = 0;
        sStack_3648.d[1] = 0;
        secp256k1_scalar_verify(&sStack_3648);
        psVar12 = &sStack_2ba8;
        psVar10 = &sStack_2798;
        for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
          (psVar10->x).n[0] = ((secp256k1_fe *)psVar12->wnaf_na_1)->n[0];
          psVar12 = (secp256k1_strauss_point_state *)((long)psVar12 + (ulong)bVar24 * -0x10 + 8);
          psVar10 = (secp256k1_ge *)((long)psVar10 + ((ulong)bVar24 * -2 + 1) * 8);
        }
        lVar6 = 0x68;
        psVar8 = &sStack_3628;
        do {
          psVar12 = &sStack_2ba8;
          puVar20 = (uint64_t *)((long)sStack_2798.x.n + lVar6);
          for (lVar23 = 0xd; lVar23 != 0; lVar23 = lVar23 + -1) {
            *puVar20 = ((secp256k1_fe *)psVar12->wnaf_na_1)->n[0];
            psVar12 = (secp256k1_strauss_point_state *)((long)psVar12 + (ulong)bVar24 * -0x10 + 8);
            puVar20 = puVar20 + (ulong)bVar24 * -2 + 1;
          }
          testutil_random_scalar_order(psVar8);
          secp256k1_scalar_add(&sStack_3648,&sStack_3648,psVar8);
          secp256k1_scalar_negate(psVar8,psVar8);
          lVar6 = lVar6 + 0x68;
          psVar8 = psVar8 + 1;
        } while (lVar6 != 0xd00);
        psVar18 = (secp256k1_strauss_point_state *)&CTX->error_callback;
        psVar8 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        cbdata = &psStack_3940;
        psVar16 = psVar14;
        iVar4 = (*(code *)psVar17)(psVar18,psVar14,(secp256k1_strauss_point_state *)auStack_3810);
        if (iVar4 == 0) goto LAB_0015781d;
        psVar18 = (secp256k1_strauss_point_state *)auStack_3810;
        secp256k1_gej_verify((secp256k1_gej *)auStack_3810);
        if (auStack_3810._144_4_ == 0) goto LAB_00157822;
        uVar7 = uVar7 + 1;
      } while ((int)uVar7 < COUNT);
      if (0 < COUNT) {
        iVar4 = 0;
        do {
          secp256k1_gej_set_infinity((secp256k1_gej *)auStack_3810);
          testutil_random_scalar_order(&sStack_3648);
          psVar10 = &sStack_2798;
          lVar6 = 0;
          do {
            uVar3 = sStack_3648.d[3];
            uVar2 = sStack_3648.d[2];
            uVar1 = sStack_3648.d[1];
            *(uint64_t *)((long)sStack_3648.d + lVar6) = sStack_3648.d[0];
            *(uint64_t *)((long)sStack_3648.d + lVar6 + 8) = uVar1;
            *(uint64_t *)((long)sStack_3648.d + lVar6 + 0x10) = uVar2;
            *(uint64_t *)((long)sStack_3648.d + lVar6 + 0x18) = uVar3;
            testutil_random_ge_test((secp256k1_ge *)&sStack_2ba8);
            psVar12 = &sStack_2ba8;
            psVar19 = psVar10;
            for (lVar23 = 0xd; lVar23 != 0; lVar23 = lVar23 + -1) {
              (psVar19->x).n[0] = ((secp256k1_fe *)psVar12->wnaf_na_1)->n[0];
              psVar12 = (secp256k1_strauss_point_state *)((long)psVar12 + (ulong)bVar24 * -0x10 + 8)
              ;
              psVar19 = (secp256k1_ge *)((long)psVar19 + (ulong)bVar24 * -0x10 + 8);
            }
            secp256k1_gej_add_ge_var
                      ((secp256k1_gej *)auStack_3810,(secp256k1_gej *)auStack_3810,psVar10,
                       (secp256k1_fe *)0x0);
            lVar6 = lVar6 + 0x20;
            psVar10 = psVar10 + 1;
          } while (lVar6 != 0x280);
          sStack_3778.x.n[0] = (uint64_t)asStack_30d8;
          sStack_3778.x.n[1] = (uint64_t)asStack_2f58;
          sStack_3778.x.n[2] = (uint64_t)&sStack_2ba8;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&sStack_3778,&sStack_3248,1,
                     (secp256k1_gej *)auStack_3810,&sStack_3648,&secp256k1_scalar_zero);
          psVar18 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar22 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          cbdata = &psStack_3940;
          psVar16 = psVar14;
          iVar5 = (*(code *)psVar17)(psVar18,psVar14,(secp256k1_strauss_point_state *)auStack_3810);
          if (iVar5 == 0) goto LAB_00157827;
          psVar16 = &sStack_3248;
          psVar18 = (secp256k1_strauss_point_state *)auStack_3810;
          iVar5 = secp256k1_gej_eq_var((secp256k1_gej *)auStack_3810,&sStack_3248);
          if (iVar5 == 0) goto LAB_0015782c;
          iVar4 = iVar4 + 1;
        } while (iVar4 < COUNT);
        if (0 < COUNT) {
          iVar4 = 0;
          do {
            sStack_38a8.x.n[2] = 0;
            sStack_38a8.x.n[3] = 0;
            sStack_38a8.x.n[0] = 0;
            sStack_38a8.x.n[1] = 0;
            secp256k1_scalar_verify((secp256k1_scalar *)&sStack_38a8);
            testutil_random_ge_test((secp256k1_ge *)&sStack_3170);
            psVar22 = &sStack_3648;
            lVar6 = 0;
            do {
              testutil_random_scalar_order(psVar22);
              psVar16 = &sStack_3170;
              puVar20 = (uint64_t *)((long)sStack_2798.x.n + lVar6);
              for (lVar23 = 0xd; lVar23 != 0; lVar23 = lVar23 + -1) {
                *puVar20 = (psVar16->x).n[0];
                psVar16 = (secp256k1_gej *)((long)psVar16 + (ulong)bVar24 * -0x10 + 8);
                puVar20 = puVar20 + (ulong)bVar24 * -2 + 1;
              }
              secp256k1_scalar_add
                        ((secp256k1_scalar *)&sStack_38a8,(secp256k1_scalar *)&sStack_38a8,psVar22);
              lVar6 = lVar6 + 0x68;
              psVar22 = psVar22 + 1;
            } while (lVar6 != 0x820);
            secp256k1_gej_set_ge(&sStack_3778,&sStack_2798);
            sStack_36e0.x.n[0] = (uint64_t)asStack_30d8;
            sStack_36e0.x.n[1] = (uint64_t)asStack_2f58;
            sStack_36e0.x.n[2] = (uint64_t)&sStack_2ba8;
            secp256k1_ecmult_strauss_wnaf
                      ((secp256k1_strauss_state *)&sStack_36e0,&sStack_3248,1,&sStack_3778,
                       (secp256k1_scalar *)&sStack_38a8,&secp256k1_scalar_zero);
            psVar18 = (secp256k1_strauss_point_state *)&CTX->error_callback;
            psVar12 = (secp256k1_strauss_point_state *)auStack_3810;
            psVar22 = &secp256k1_scalar_zero;
            cb = ecmult_multi_callback;
            cbdata = &psStack_3940;
            psVar16 = psVar14;
            iVar5 = (*(code *)psVar17)(psVar18,psVar14,psVar12);
            if (iVar5 == 0) goto LAB_00157836;
            psVar16 = &sStack_3248;
            iVar5 = secp256k1_gej_eq_var((secp256k1_gej *)psVar12,psVar16);
            if (iVar5 == 0) goto LAB_0015783b;
            iVar4 = iVar4 + 1;
          } while (iVar4 < COUNT);
        }
      }
    }
  }
  lVar6 = 0;
  psVar10 = &sStack_2798;
  do {
    testutil_random_scalar_order((secp256k1_scalar *)((long)sStack_3648.d + lVar6));
    testutil_random_ge_test(psVar10);
    psVar10 = psVar10 + 1;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0x280);
  sStack_3648.d[2] = 0;
  sStack_3648.d[3] = 0;
  sStack_3648.d[0] = 0;
  sStack_3648.d[1] = 0;
  secp256k1_scalar_verify(&sStack_3648);
  psVar12 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar22 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &psStack_3940;
  psVar16 = psVar14;
  iVar4 = (*(code *)psVar17)(psVar12,psVar14,auStack_3810);
  if (iVar4 == 0) goto LAB_00157840;
  sStack_3628.d[2] = 0;
  sStack_3628.d[3] = 0;
  sStack_3628.d[0] = 0;
  sStack_3628.d[1] = 0;
  secp256k1_scalar_verify(&sStack_3628);
  sStack_3608.d[2] = 0;
  sStack_3608.d[3] = 0;
  sStack_3608.d[0] = 0;
  sStack_3608.d[1] = 0;
  secp256k1_scalar_verify(&sStack_3608);
  sStack_35e8.d[2] = 0;
  sStack_35e8.d[3] = 0;
  sStack_35e8.d[0] = 0;
  sStack_35e8.d[1] = 0;
  secp256k1_scalar_verify(&sStack_35e8);
  asStack_35c8[0].d[2] = 0;
  asStack_35c8[0].d[3] = 0;
  asStack_35c8[0].d[0] = 0;
  asStack_35c8[0].d[1] = 0;
  secp256k1_scalar_verify(asStack_35c8);
  psVar12 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar22 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &psStack_3940;
  psVar16 = psVar14;
  iVar4 = (*(code *)psVar17)(psVar12,psVar14,auStack_3810);
  if (iVar4 == 0) goto LAB_00157845;
  psVar12 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar22 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &psStack_3940;
  psVar16 = psVar14;
  iVar4 = (*(code *)psVar17)(psVar12,psVar14,auStack_3810);
  if (iVar4 != 0) {
    psVar12 = (secp256k1_strauss_point_state *)auStack_3810;
    secp256k1_gej_verify((secp256k1_gej *)psVar12);
    if (auStack_3810._144_4_ != 0) {
      testutil_random_ge_test(&sStack_2c10);
      secp256k1_gej_set_ge(&sStack_3778,&sStack_2c10);
      uStack_3930 = 0;
      do {
        uStack_3928 = uStack_3930 + 1 >> 1;
        uStack_3920 = (ulong)((uint)uStack_3930 & 1);
        uVar11 = 0;
        uStack_3930 = uStack_3930 + 1;
        do {
          uVar13 = uStack_3920;
          sStack_38e0.d[3] = 0;
          sStack_38e0.d[1] = 0;
          sStack_38e0.d[2] = 0;
          sStack_38e0.d[0] = uStack_3928;
          secp256k1_scalar_verify(&sStack_38e0);
          secp256k1_scalar_cond_negate(&sStack_38e0,(int)uVar13);
          uStack_3918 = uVar11 + 1;
          sStack_3900.d[0] = uStack_3918 >> 1;
          sStack_3900.d[1] = 0;
          sStack_3900.d[2] = 0;
          sStack_3900.d[3] = 0;
          secp256k1_scalar_verify(&sStack_3900);
          secp256k1_scalar_cond_negate(&sStack_3900,(uint)uVar11 & 1);
          sStack_38a8.x.n[0] = (uint64_t)asStack_30d8;
          sStack_38a8.x.n[1] = (uint64_t)asStack_2f58;
          sStack_38a8.x.n[2] = (uint64_t)&sStack_2ba8;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&sStack_38a8,&sStack_3170,1,&sStack_3778,
                     &sStack_38e0,&secp256k1_scalar_zero);
          sStack_36e0.x.n[0] = (uint64_t)asStack_30d8;
          sStack_36e0.x.n[1] = (uint64_t)asStack_2f58;
          sStack_36e0.x.n[2] = (uint64_t)&sStack_2ba8;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&sStack_36e0,&sStack_38a8,1,&sStack_3778,
                     &sStack_3900,&secp256k1_scalar_zero);
          uStack_3910 = 0;
          do {
            uStack_3908 = uStack_3910 + 1 >> 1;
            uVar7 = (uint)uStack_3910;
            uVar11 = 0;
            uStack_3910 = uStack_3910 + 1;
            do {
              secp256k1_ge_set_gej(&sStack_2798,&sStack_3170);
              secp256k1_ge_set_gej(asStack_2730,&sStack_38a8);
              sStack_3648.d[0] = uStack_3908;
              sStack_3648.d[3] = 0;
              sStack_3648.d[1] = 0;
              sStack_3648.d[2] = 0;
              secp256k1_scalar_verify(&sStack_3648);
              secp256k1_scalar_cond_negate(&sStack_3648,uVar7 & 1);
              uVar13 = uVar11 + 1;
              sStack_3628.d[0] = uVar13 >> 1;
              sStack_3628.d[1] = 0;
              sStack_3628.d[2] = 0;
              sStack_3628.d[3] = 0;
              secp256k1_scalar_verify(&sStack_3628);
              psVar15 = &sStack_36e0;
              secp256k1_scalar_cond_negate(&sStack_3628,(uint)uVar11 & 1);
              secp256k1_scalar_mul(&sStack_3190,&sStack_38e0,&sStack_3648);
              secp256k1_scalar_mul(&sStack_31b0,&sStack_3900,&sStack_3628);
              secp256k1_scalar_add(&sStack_3190,&sStack_3190,&sStack_31b0);
              sStack_38c0.aux = asStack_30d8;
              sStack_38c0.pre_a = asStack_2f58;
              psVar12 = &sStack_2ba8;
              sStack_38c0.ps = psVar12;
              secp256k1_ecmult_strauss_wnaf
                        (&sStack_38c0,psVar15,1,&sStack_3778,&sStack_3190,&secp256k1_scalar_zero);
              psVar18 = (secp256k1_strauss_point_state *)&CTX->error_callback;
              psVar8 = &secp256k1_scalar_zero;
              cb = ecmult_multi_callback;
              ppsVar21 = &psStack_3940;
              psVar16 = psVar14;
              iVar4 = (*(code *)psVar17)(psVar18,psVar14,psVar12);
              if (iVar4 == 0) {
                test_ecmult_multi_cold_3();
LAB_001577c3:
                test_ecmult_multi_cold_2();
                goto LAB_001577c8;
              }
              iVar4 = secp256k1_gej_eq_var((secp256k1_gej *)psVar12,psVar15);
              psVar16 = psVar15;
              psVar18 = psVar12;
              if (iVar4 == 0) goto LAB_001577c3;
              uVar11 = uVar13;
            } while (uVar13 != 8);
          } while (uStack_3910 != 8);
          uVar11 = uStack_3918;
        } while (uStack_3918 != 8);
        if (uStack_3930 == 8) {
          return;
        }
      } while( true );
    }
    goto LAB_0015784f;
  }
  goto LAB_0015784a;
LAB_001577c8:
  test_ecmult_multi_cold_21();
LAB_001577cd:
  test_ecmult_multi_cold_20();
LAB_001577d2:
  test_ecmult_multi_cold_19();
LAB_001577d7:
  test_ecmult_multi_cold_18();
LAB_001577dc:
  test_ecmult_multi_cold_17();
LAB_001577e1:
  test_ecmult_multi_cold_16();
LAB_001577e6:
  test_ecmult_multi_cold_15();
LAB_001577eb:
  test_ecmult_multi_cold_14();
LAB_001577f0:
  test_ecmult_multi_cold_29();
LAB_001577f5:
  test_ecmult_multi_cold_28();
LAB_001577fa:
  psVar15 = psVar16;
  test_ecmult_multi_cold_27();
LAB_001577ff:
  test_ecmult_multi_cold_26();
LAB_00157804:
  cbdata = ppsVar21;
  test_ecmult_multi_cold_1();
LAB_00157809:
  test_ecmult_multi_cold_25();
LAB_0015780e:
  test_ecmult_multi_cold_24();
LAB_00157813:
  psVar16 = psVar15;
  test_ecmult_multi_cold_23();
LAB_00157818:
  test_ecmult_multi_cold_22();
LAB_0015781d:
  psVar22 = psVar8;
  test_ecmult_multi_cold_13();
LAB_00157822:
  test_ecmult_multi_cold_12();
LAB_00157827:
  test_ecmult_multi_cold_11();
LAB_0015782c:
  test_ecmult_multi_cold_10();
LAB_00157831:
  test_ecmult_multi_cold_30();
LAB_00157836:
  psVar12 = psVar18;
  test_ecmult_multi_cold_9();
LAB_0015783b:
  test_ecmult_multi_cold_8();
LAB_00157840:
  test_ecmult_multi_cold_7();
LAB_00157845:
  test_ecmult_multi_cold_6();
LAB_0015784a:
  test_ecmult_multi_cold_5();
LAB_0015784f:
  test_ecmult_multi_cold_4();
  secp256k1_ecmult_pippenger_batch
            ((secp256k1_callback *)psVar12,(secp256k1_scratch *)psVar16,r,psVar22,cb,cbdata,
             sStack_3960,0);
  return;
}

Assistant:

static void test_ecmult_target(const secp256k1_scalar* target, int mode) {
    /* Mode: 0=ecmult_gen, 1=ecmult, 2=ecmult_const */
    secp256k1_scalar n1, n2;
    secp256k1_ge p;
    secp256k1_gej pj, p1j, p2j, ptj;

    /* Generate random n1,n2 such that n1+n2 = -target. */
    testutil_random_scalar_order_test(&n1);
    secp256k1_scalar_add(&n2, &n1, target);
    secp256k1_scalar_negate(&n2, &n2);

    /* Generate a random input point. */
    if (mode != 0) {
        testutil_random_ge_test(&p);
        secp256k1_gej_set_ge(&pj, &p);
    }

    /* EC multiplications */
    if (mode == 0) {
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p1j, &n1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p2j, &n2);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &ptj, target);
    } else if (mode == 1) {
        secp256k1_ecmult(&p1j, &pj, &n1, &secp256k1_scalar_zero);
        secp256k1_ecmult(&p2j, &pj, &n2, &secp256k1_scalar_zero);
        secp256k1_ecmult(&ptj, &pj, target, &secp256k1_scalar_zero);
    } else {
        secp256k1_ecmult_const(&p1j, &p, &n1);
        secp256k1_ecmult_const(&p2j, &p, &n2);
        secp256k1_ecmult_const(&ptj, &p, target);
    }

    /* Add them all up: n1*P + n2*P + target*P = (n1+n2+target)*P = (n1+n1-n1-n2)*P = 0. */
    secp256k1_gej_add_var(&ptj, &ptj, &p1j, NULL);
    secp256k1_gej_add_var(&ptj, &ptj, &p2j, NULL);
    CHECK(secp256k1_gej_is_infinity(&ptj));
}